

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand
          (cmGlobalUnixMakefileGenerator3 *this,string *sourceFile,string *workingDirectory,
          string *compileCommand,string *objPath)

{
  bool bVar1;
  cmake *this_00;
  string *__lhs;
  type pcVar2;
  ostream *poVar3;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  string commandDatabaseName;
  string *objPath_local;
  string *compileCommand_local;
  string *workingDirectory_local;
  string *sourceFile_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  commandDatabaseName.field_2._8_8_ = objPath;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->CommandDatabase);
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CommandDatabase);
    std::operator<<((ostream *)pcVar2,",\n");
  }
  else {
    this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
    __lhs = cmake::GetHomeOutputDirectory_abi_cxx11_(this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   __lhs,"/compile_commands.json");
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::operator=
              (&this->CommandDatabase,
               (unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               local_58);
    std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
              ((unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> *)
               local_58);
    pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->CommandDatabase);
    std::operator<<((ostream *)pcVar2,"[\n");
    std::__cxx11::string::~string((string *)local_50);
  }
  pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
           operator*(&this->CommandDatabase);
  poVar3 = std::operator<<((ostream *)pcVar2,"{\n");
  poVar3 = std::operator<<(poVar3,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_88,workingDirectory);
  poVar3 = std::operator<<(poVar3,(string *)&local_88);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_a8,compileCommand);
  poVar3 = std::operator<<(poVar3,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_c8,sourceFile);
  poVar3 = std::operator<<(poVar3,(string *)&local_c8);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"output\": \"");
  cmGlobalGenerator::EscapeJSON(&local_e8,(string *)commandDatabaseName.field_2._8_8_);
  poVar3 = std::operator<<(poVar3,(string *)&local_e8);
  std::operator<<(poVar3,"\"\n}");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand(
  const std::string& sourceFile, const std::string& workingDirectory,
  const std::string& compileCommand, const std::string& objPath)
{
  if (!this->CommandDatabase) {
    std::string commandDatabaseName =
      this->GetCMakeInstance()->GetHomeOutputDirectory() +
      "/compile_commands.json";
    this->CommandDatabase =
      cm::make_unique<cmGeneratedFileStream>(commandDatabaseName);
    *this->CommandDatabase << "[\n";
  } else {
    *this->CommandDatabase << ",\n";
  }
  *this->CommandDatabase << "{\n"
                         << R"(  "directory": ")"
                         << cmGlobalGenerator::EscapeJSON(workingDirectory)
                         << "\",\n"
                         << R"(  "command": ")"
                         << cmGlobalGenerator::EscapeJSON(compileCommand)
                         << "\",\n"
                         << R"(  "file": ")"
                         << cmGlobalGenerator::EscapeJSON(sourceFile)
                         << "\",\n"
                         << R"(  "output": ")"
                         << cmGlobalGenerator::EscapeJSON(objPath) << "\"\n}";
}